

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

size_t revealSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *output,
                  size_t outputSize,picnic_instance_t *params)

{
  uint *__ptr;
  size_t __n;
  size_t i;
  size_t sVar1;
  uint8_t *__dest;
  size_t sVar2;
  size_t revealedSize;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedNodes(tree,hideList,hideListSize,&local_38);
  sVar2 = local_38;
  __n = (size_t)params->seed_size;
  if (local_38 * __n < outputSize || local_38 * __n - outputSize == 0) {
    __dest = output;
    for (sVar1 = 0; sVar2 != sVar1; sVar1 = sVar1 + 1) {
      memcpy(__dest,tree->nodes + __ptr[sVar1] * (int)__n,__n);
      __n = (size_t)params->seed_size;
      __dest = __dest + __n;
    }
    free(__ptr);
    sVar2 = (long)__dest - (long)output;
  }
  else {
    free(__ptr);
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t revealSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* output,
                   size_t outputSize, const picnic_instance_t* params) {
  uint8_t* outputBase = output;
  size_t revealedSize = 0;

  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (outputSize < params->seed_size * revealedSize) {
    assert(!"Insufficient sized buffer provided to revealSeeds");
    free(revealed);
    return 0;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * params->seed_size], params->seed_size);
    output += params->seed_size;
  }

  free(revealed);
  return output - outputBase;
}